

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

AllocatedBlock * __thiscall ctemplate::BaseArena::IndexToBlock(BaseArena *this,int index)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar1;
  pointer pAVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  
  if ((uint)index < 0x10) {
    return this->first_blocks_ + (uint)index;
  }
  pvVar1 = this->overflow_blocks_;
  if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","overflow_blocks_ != NULL");
  }
  else {
    uVar5 = index - 0x10;
    if ((int)uVar5 < 0) {
      pcVar4 = "index_in_overflow_blocks";
      pcVar3 = ">=";
      pcVar6 = "0";
    }
    else {
      pAVar2 = (pvVar1->
               super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar5 <
          (ulong)((long)(pvVar1->
                        super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4)) {
        return pAVar2 + uVar5;
      }
      pcVar4 = "static_cast<size_t>(index_in_overflow_blocks)";
      pcVar3 = "<";
      pcVar6 = "overflow_blocks_->size()";
    }
    fprintf(_stderr,"Check failed: %s %s %s\n",pcVar4,pcVar3,pcVar6);
  }
  exit(1);
}

Assistant:

const BaseArena::AllocatedBlock *BaseArena::IndexToBlock(int index) const {
  if (index < ARRAYSIZE(first_blocks_)) {
    return &first_blocks_[index];
  }
  CHECK(overflow_blocks_ != NULL);
  int index_in_overflow_blocks = index - ARRAYSIZE(first_blocks_);
  CHECK_GE(index_in_overflow_blocks, 0);
  CHECK_LT(static_cast<size_t>(index_in_overflow_blocks),
           overflow_blocks_->size());
  return &(*overflow_blocks_)[index_in_overflow_blocks];
}